

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptm_mgau.c
# Opt level: O2

void ptm_mgau_free(ps_mgau_t *ps)

{
  long lVar1;
  long lVar2;
  
  logmath_free((logmath_t *)ps[7].vt);
  logmath_free(*(logmath_t **)&ps[6].frame_idx);
  if (*(long *)&ps[3].frame_idx == 0) {
    ckd_free_3d(ps[3].vt);
  }
  else {
    ckd_free_2d(ps[3].vt);
    mmio_file_unmap(*(mmio_file_t **)&ps[3].frame_idx);
  }
  ckd_free(*(void **)&ps[2].frame_idx);
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < *(int *)&ps[6].vt; lVar2 = lVar2 + 1) {
    ckd_free_3d(*(void **)((long)&(ps[5].vt)->name + lVar1));
    ckd_free(*(void **)((long)&(ps[5].vt)->frame_eval + lVar1));
    lVar1 = lVar1 + 0x10;
  }
  ckd_free(ps[5].vt);
  gauden_free(*(gauden_t **)&ps[1].frame_idx);
  ckd_free(ps);
  return;
}

Assistant:

void
ptm_mgau_free(ps_mgau_t *ps)
{
    int i;
    ptm_mgau_t *s = (ptm_mgau_t *)ps;

    logmath_free(s->lmath);
    logmath_free(s->lmath_8b);
    if (s->sendump_mmap) {
        ckd_free_2d(s->mixw); 
        mmio_file_unmap(s->sendump_mmap);
    }
    else {
        ckd_free_3d(s->mixw);
    }
    ckd_free(s->sen2cb);
    
    for (i = 0; i < s->n_fast_hist; i++) {
	ckd_free_3d(s->hist[i].topn);
	bitvec_free(s->hist[i].mgau_active);
    }
    ckd_free(s->hist);
    
    gauden_free(s->g);
    ckd_free(s);
}